

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall
lzham::lzcompressor::code_decision
          (lzcompressor *this,lzdecision lzdec,uint *cur_ofs,uint *bytes_to_match)

{
  uint uVar1;
  bool bVar2;
  lzdecision local_30;
  
  local_30.m_dist = lzdec.m_dist;
  local_30._0_8_ = lzdec._0_8_;
  bVar2 = state::encode(&this->m_state,&this->m_codec,&this->super_CLZBase,&this->m_accel,&local_30)
  ;
  if (bVar2) {
    uVar1 = 1;
    if (1 < (uint)lzdec.m_len) {
      uVar1 = lzdec.m_len;
    }
    *cur_ofs = *cur_ofs + uVar1;
    *bytes_to_match = *bytes_to_match - uVar1;
    this->m_step = this->m_step + 1;
  }
  return bVar2;
}

Assistant:

bool lzcompressor::code_decision(lzdecision lzdec, uint& cur_ofs, uint& bytes_to_match)
   {
#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(CLZBase::cLZHAMDebugSyncMarkerValue, CLZBase::cLZHAMDebugSyncMarkerBits)) return false;
      if (!m_codec.encode_bits(lzdec.is_match(), 1)) return false;
      if (!m_codec.encode_bits(lzdec.get_len(), 17)) return false;
      if (!m_codec.encode_bits(m_state.m_cur_state, 4)) return false;
#endif

#ifdef LZHAM_LZVERIFY
      if (lzdec.is_match())
      {
         uint match_dist = lzdec.get_match_dist(m_state);

         LZHAM_VERIFY(m_accel[cur_ofs] == m_accel[(cur_ofs - match_dist) & (m_accel.get_max_dict_size() - 1)]);
      }
#endif

      const uint len = lzdec.get_len();

      if (!m_state.encode(m_codec, *this, m_accel, lzdec))
      {
         LZHAM_LOG_ERROR(7013);
         return false;
      }

      cur_ofs += len;
      LZHAM_ASSERT(bytes_to_match >= len);
      bytes_to_match -= len;

      //m_accel.advance_bytes(len);

      m_step++;

      return true;
   }